

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall cornerstone::raft_server::commit_in_bg(raft_server *this)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t __mutex;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  runtime_error *prVar7;
  ulong *puVar8;
  ptr<cluster_config> new_conf;
  ptr<log_entry> log_entry;
  long *local_158 [2];
  long local_148 [2];
  cluster_config local_138;
  unique_lock *local_110;
  __native_type *local_108;
  unique_lock<std::mutex> local_100;
  __native_type local_f0 [2];
  char *local_98;
  
  local_108 = (__native_type *)&this->commit_lock_;
  local_110 = (unique_lock *)&this->commit_cv_;
  local_138.servers_.
  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ._M_impl._M_node._M_size = (size_t)&this->stopping_lock_;
LAB_00148ba5:
  do {
    uVar1 = this->sm_commit_index_;
    if (uVar1 < this->quick_commit_idx_) {
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      if (uVar1 < CONCAT44(extraout_var,iVar5) - 1U) {
        while (uVar1 = this->sm_commit_index_, uVar1 < this->quick_commit_idx_) {
          iVar5 = (*((this->log_store_).
                     super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->_vptr_log_store[2])();
          if (CONCAT44(extraout_var_00,iVar5) - 1U <= uVar1) break;
          this->sm_commit_index_ = this->sm_commit_index_ + 1;
          (*((this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_log_store[8])(&local_138.servers_);
          if (*(int *)&(local_138.servers_.
                        super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next)->_M_prev == 2) {
            iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
            if (iVar5 != 0) {
              std::__throw_system_error(iVar5);
            }
            if (local_138.servers_.
                super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev == (_List_node_base *)0x0)
            {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar7,"get_buf cannot be called for a log_entry with nil buffer");
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            buffer::pos((buffer *)
                        local_138.servers_.
                        super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,0);
            if (local_138.servers_.
                super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev == (_List_node_base *)0x0)
            {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar7,"get_buf cannot be called for a log_entry with nil buffer");
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            cluster_config::deserialize
                      (&local_138,
                       (buffer *)
                       local_138.servers_.
                       super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev);
            peVar3 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_98 = "config at index %llu is committed";
            snprintf((char *)&local_100,100,"config at index %llu is committed",
                     *(ulong *)local_138.log_idx_);
            local_158[0] = local_148;
            sVar6 = strlen((char *)&local_100);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_158,&local_100,(long)&local_100._M_device + sVar6);
            (*peVar3->_vptr_logger[3])(peVar3,(string *)local_158);
            if (local_158[0] != local_148) {
              operator_delete(local_158[0],local_148[0] + 1);
            }
            plVar4 = *(long **)&(((this->ctx_)._M_t.
                                  super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                                  .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl
                                 )->state_mgr_).
                                super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>
            ;
            (**(code **)(*plVar4 + 0x18))(plVar4,local_138.log_idx_);
            this->config_changing_ = false;
            if (((this->config_).
                 super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->log_idx_ < *(ulong *)local_138.log_idx_) {
              reconfigure(this,(ptr<cluster_config> *)&local_138);
            }
            if (this->catching_up_ == true) {
              puVar8 = (ulong *)(local_138.log_idx_ + 0x10);
              do {
                puVar8 = (ulong *)*puVar8;
                if (puVar8 == (ulong *)(local_138.log_idx_ + 0x10)) goto LAB_00148de1;
              } while (*(int *)puVar8[2] != this->id_);
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar8[3];
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              peVar3 = (this->l_).
                       super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_100._M_device = (mutex_type *)local_f0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_100,"this server is committed as one of cluster members",
                         "");
              (*peVar3->_vptr_logger[3])(peVar3,&local_100);
              if ((__native_type *)local_100._M_device != local_f0) {
                operator_delete(local_100._M_device,local_f0[0].__align + 1);
              }
              this->catching_up_ = false;
            }
LAB_00148de1:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.prev_log_idx_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.prev_log_idx_);
            }
            pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
          }
          else if (*(int *)&(local_138.servers_.
                             super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next)->_M_prev == 1) {
            if (local_138.servers_.
                super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev == (_List_node_base *)0x0)
            {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar7,"get_buf cannot be called for a log_entry with nil buffer");
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            peVar2 = (this->state_machine_).
                     super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (*peVar2->_vptr_state_machine[2])
                      (peVar2,this->sm_commit_index_,
                       local_138.servers_.
                       super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev,
                       local_138.servers_.
                       super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next + 2);
          }
          snapshot_and_compact(this,this->sm_commit_index_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_138.servers_.
              super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_138.servers_.
                       super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev);
          }
        }
        goto LAB_00148ba5;
      }
    }
    plVar4 = (long *)(((this->ctx_)._M_t.
                       super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                       .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                     event_listener_).
                     super___shared_ptr<cornerstone::raft_event_listener,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4,3);
    }
    local_100._M_device = (mutex_type *)local_108;
    local_100._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_100);
    local_100._M_owns = true;
    std::condition_variable::wait(local_110);
    __mutex = local_138.servers_.
              super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
              ._M_impl._M_node._M_size;
    if (this->stopping_ == true) {
      std::unique_lock<std::mutex>::unlock(&local_100);
      local_100._M_device = (mutex_type *)0x0;
      local_100._M_owns = false;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      std::condition_variable::notify_all();
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::unique_lock<std::mutex>::~unique_lock(&local_100);
      return;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_100);
  } while( true );
}

Assistant:

void raft_server::commit_in_bg()
{
    while (true)
    {
        try
        {
            while (quick_commit_idx_ <= sm_commit_index_ || sm_commit_index_ >= log_store_->next_slot() - 1)
            {
                // already catch up all committed logs
                if (ctx_->event_listener_)
                {
                    ctx_->event_listener_->on_event(raft_event::logs_catch_up);
                }

                std::unique_lock<std::mutex> lock(commit_lock_);
                commit_cv_.wait(lock);
                if (stopping_)
                {
                    lock.unlock();
                    lock.release();
                    {
                        auto_lock(stopping_lock_);
                        ready_to_stop_cv_.notify_all();
                    }

                    return;
                }
            }

            while (sm_commit_index_ < quick_commit_idx_ && sm_commit_index_ < log_store_->next_slot() - 1)
            {
                sm_commit_index_ += 1;
                ptr<log_entry> log_entry(log_store_->entry_at(sm_commit_index_));
                if (log_entry->get_val_type() == log_val_type::app_log)
                {
                    state_machine_->commit(sm_commit_index_, log_entry->get_buf(), log_entry->get_cookie());
                }
                else if (log_entry->get_val_type() == log_val_type::conf)
                {
                    recur_lock(lock_);
                    log_entry->get_buf().pos(0);
                    ptr<cluster_config> new_conf = cluster_config::deserialize(log_entry->get_buf());
                    l_->info(sstrfmt("config at index %llu is committed").fmt(new_conf->get_log_idx()));
                    ctx_->state_mgr_->save_config(*new_conf);
                    config_changing_ = false;
                    if (config_->get_log_idx() < new_conf->get_log_idx())
                    {
                        reconfigure(new_conf);
                    }

                    if (catching_up_ && new_conf->get_server(id_) != nilptr)
                    {
                        l_->info("this server is committed as one of cluster members");
                        catching_up_ = false;
                    }
                }

                snapshot_and_compact(sm_commit_index_);
            }
        }
        catch (std::exception& err)
        {
            l_->err(lstrfmt("background committing thread encounter err %s, exiting to protect the system")
                        .fmt(err.what()));
            ctx_->state_mgr_->system_exit(-1);
        }
    }
}